

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int reason_code_to_str(char *str,size_t len,http_reason_code_t rt)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *__src;
  
  pcVar2 = reason_code_name[5];
  __src = reason_code_name[4];
  pcVar1 = reason_code_name[3];
  pcVar5 = reason_code_name[0];
  if ((int)rt < 0x19d) {
    if (rt == OK) {
      sVar4 = strlen(reason_code_name[3]);
      iVar3 = 3;
      __src = pcVar1;
      goto LAB_00103d3f;
    }
    if (rt == Bad_Request) {
      sVar4 = strlen(reason_code_name[0]);
      iVar3 = 1;
      __src = pcVar5;
      goto LAB_00103d3f;
    }
    pcVar5 = reason_code_name[1];
    if (rt != Not_found) {
      return 0;
    }
  }
  else {
    pcVar5 = reason_code_name[2];
    if (rt != Entity_Too_Large) {
      if (rt == Internal_Error) {
        sVar4 = strlen(reason_code_name[4]);
        iVar3 = 4;
      }
      else {
        if (rt != Not_implemented) {
          return 0;
        }
        sVar4 = strlen(reason_code_name[5]);
        iVar3 = 5;
        __src = pcVar2;
      }
      goto LAB_00103d3f;
    }
  }
  sVar4 = strlen(pcVar5);
  iVar3 = 2;
  __src = pcVar5;
LAB_00103d3f:
  if (sVar4 < len) {
    strcpy(str,__src);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int reason_code_to_str(char *str, size_t len, http_reason_code_t rt)
{

  size_t reason_code_size;

  switch(rt)
    {
    case Bad_Request:
      reason_code_size=strlen(reason_code_name[0]);
      if(len <= reason_code_size)
        return 1;
      strcpy(str, reason_code_name[0]);
      break;
    case Not_found:
      reason_code_size=strlen(reason_code_name[1]);
      if(len <= reason_code_size)
        return 2;
      strcpy(str,reason_code_name[1]);
      break;
    case Entity_Too_Large:
      reason_code_size=strlen(reason_code_name[2]);
      if(len <= reason_code_size)
        return 2;
      strcpy(str,reason_code_name[2]);
      break;
    case OK:
      reason_code_size=strlen(reason_code_name[3]);
      if(len <= reason_code_size)
        return 3;
      strcpy(str,reason_code_name[3]);
      break;
    case Internal_Error:
      reason_code_size=strlen(reason_code_name[4]);
      if(len <= reason_code_size)
        return 4;
      strcpy(str,reason_code_name[4]);
      break;
    case Not_implemented:
      reason_code_size=strlen(reason_code_name[5]);
      if(len <= reason_code_size)
        return 5;
      strcpy(str,reason_code_name[5]);
      break;
    }
  return 0;
}